

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aligned.hpp
# Opt level: O1

unsigned_long pstore::calc_alignment<unsigned_long>(unsigned_long v,size_t align)

{
  unsigned_long uVar1;
  
  if ((int)POPCOUNT(align) == 1) {
    if (align == 0) {
      uVar1 = 0;
    }
    else {
      uVar1 = (-align & (v + align) - 1) - v;
    }
    return uVar1;
  }
  assert_failed("is_power_of_two (align)",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/support/aligned.hpp"
                ,0x57);
}

Assistant:

constexpr Ty calc_alignment (Ty const v, std::size_t const align) noexcept {
        PSTORE_ASSERT (is_power_of_two (align));
        return (align == 0U) ? 0U : ((v + align - 1U) & ~(align - 1U)) - v;
    }